

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ItaniumDemangle.cpp
# Opt level: O0

Node * __thiscall anon_unknown.dwarf_4161a3::Db::parseUnqualifiedName(Db *this,NameState *State)

{
  char cVar1;
  bool bVar2;
  NodeArray local_58;
  Node *local_48;
  Node *Binding;
  size_t BindingsBegin;
  StructuredBindingName *local_28;
  Node *Result;
  NameState *State_local;
  Db *this_local;
  
  Result = (Node *)State;
  State_local = (NameState *)this;
  cVar1 = look(this,0);
  if (cVar1 == 'U') {
    local_28 = (StructuredBindingName *)parseUnnamedTypeName(this,(NameState *)Result);
  }
  else {
    cVar1 = look(this,0);
    if ((cVar1 < '1') || (cVar1 = look(this,0), '9' < cVar1)) {
      StringView::StringView((StringView *)&BindingsBegin,"DC");
      bVar2 = consumeIf(this,_BindingsBegin);
      if (bVar2) {
        Binding = (Node *)PODSmallVector<(anonymous_namespace)::Node_*,_32UL>::size(&this->Names);
        do {
          local_48 = parseSourceName(this,(NameState *)Result);
          if (local_48 == (Node *)0x0) {
            return (Node *)0x0;
          }
          PODSmallVector<(anonymous_namespace)::Node_*,_32UL>::push_back(&this->Names,&local_48);
          bVar2 = consumeIf(this,'E');
        } while (((bVar2 ^ 0xffU) & 1) != 0);
        local_58 = popTrailingNodeArray(this,(size_t)Binding);
        local_28 = (anonymous_namespace)::Db::
                   make<(anonymous_namespace)::StructuredBindingName,(anonymous_namespace)::NodeArray>
                             ((Db *)this,&local_58);
      }
      else {
        local_28 = (StructuredBindingName *)parseOperatorName(this,(NameState *)Result);
      }
    }
    else {
      local_28 = (StructuredBindingName *)parseSourceName(this,(NameState *)Result);
    }
  }
  if (local_28 != (StructuredBindingName *)0x0) {
    local_28 = (StructuredBindingName *)parseAbiTags(this,&local_28->super_Node);
  }
  return &local_28->super_Node;
}

Assistant:

Node *Db::parseUnqualifiedName(NameState *State) {
 // <ctor-dtor-name>s are special-cased in parseNestedName().
 Node *Result;
 if (look() == 'U')
   Result = parseUnnamedTypeName(State);
 else if (look() >= '1' && look() <= '9')
   Result = parseSourceName(State);
 else if (consumeIf("DC")) {
   size_t BindingsBegin = Names.size();
   do {
     Node *Binding = parseSourceName(State);
     if (Binding == nullptr)
       return nullptr;
     Names.push_back(Binding);
   } while (!consumeIf('E'));
   Result = make<StructuredBindingName>(popTrailingNodeArray(BindingsBegin));
 } else
   Result = parseOperatorName(State);
 if (Result != nullptr)
   Result = parseAbiTags(Result);
 return Result;
}